

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

void ly_path_predicates_free(ly_ctx *ctx,ly_path_predicate *predicates)

{
  ulong uVar1;
  undefined8 *puVar2;
  lysf_ctx fctx;
  lysf_ctx local_48;
  
  local_48.mod = (lys_module *)0x0;
  local_48.ext_set.size = 0;
  local_48.ext_set.count = 0;
  local_48.ext_set.field_2.dnodes = (lyd_node **)0x0;
  if (predicates != (ly_path_predicate *)0x0) {
    local_48.ctx = ctx;
    if (*(long *)((long)&predicates[-1].field_1 + 0x28) != 0) {
      puVar2 = (undefined8 *)((long)&predicates->field_1 + 8);
      uVar1 = 0;
      do {
        if (*(int *)(puVar2 + -2) - 1U < 2) {
          if (puVar2[1] != 0) {
            (**(code **)(*(long *)(puVar2[1] + 0x10) + 0x38))(ctx,puVar2);
            lysc_type_free(&local_48,(lysc_type *)puVar2[1]);
          }
        }
        else if (*(int *)(puVar2 + -2) == 3) {
          free((void *)*puVar2);
        }
        uVar1 = uVar1 + 1;
        puVar2 = puVar2 + 7;
      } while (uVar1 < *(ulong *)((long)&predicates[-1].field_1 + 0x28));
    }
    free((void *)((long)&predicates[-1].field_1 + 0x28));
  }
  return;
}

Assistant:

void
ly_path_predicates_free(const struct ly_ctx *ctx, struct ly_path_predicate *predicates)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};

    if (!predicates) {
        return;
    }

    LY_ARRAY_FOR(predicates, u) {
        switch (predicates[u].type) {
        case LY_PATH_PREDTYPE_POSITION:
            /* nothing to free */
            break;
        case LY_PATH_PREDTYPE_LIST:
        case LY_PATH_PREDTYPE_LEAFLIST:
            if (predicates[u].value.realtype) {
                predicates[u].value.realtype->plugin->free(ctx, &predicates[u].value);
                lysc_type_free(&fctx, (struct lysc_type *)predicates[u].value.realtype);
            }
            break;
        case LY_PATH_PREDTYPE_LIST_VAR:
            free(predicates[u].variable);
            break;
        }
    }
    LY_ARRAY_FREE(predicates);
}